

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iStart;
  int *piVar1;
  BYTE *iEnd;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  BYTE *pBVar5;
  seqDef *psVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  U32 UVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  int *piVar16;
  int *piVar17;
  BYTE *ip;
  int *piVar18;
  BYTE *pBVar19;
  U32 UVar20;
  U32 UVar21;
  U32 UVar22;
  ulong uVar23;
  size_t offsetFound;
  size_t local_58;
  U32 *local_50;
  BYTE *local_48;
  ZSTD_matchState_t *local_40;
  BYTE *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar3 + uVar2;
  UVar22 = *rep;
  UVar20 = rep[1];
  pZVar4 = ms->dictMatchState;
  pBVar5 = (pZVar4->window).nextSrc;
  local_38 = (pZVar4->window).base;
  local_48 = local_38 + (pZVar4->window).dictLimit;
  ms->nextToUpdate3 = ms->nextToUpdate;
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  piVar16 = (int *)((ulong)(((int)src - (int)iStart) + (int)pBVar5 == (int)local_48) + (long)src);
  local_50 = rep;
  if (piVar16 < piVar1) {
    uVar8 = ((int)local_38 - (int)pBVar5) + uVar2;
    pBVar19 = local_38 + -(ulong)uVar8;
    local_40 = ms;
    do {
      piVar17 = (int *)((long)piVar16 + 1);
      uVar9 = (((int)piVar16 - (int)pBVar3) - UVar22) + 1;
      piVar18 = (int *)(pBVar3 + uVar9);
      if (uVar9 < uVar2) {
        piVar18 = (int *)(local_38 + (uVar9 - uVar8));
      }
      bVar7 = true;
      if ((uVar9 - uVar2 < 0xfffffffd) && (*piVar18 == *piVar17)) {
        pBVar13 = iEnd;
        if (uVar9 < uVar2) {
          pBVar13 = pBVar5;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar16 + 5),(BYTE *)(piVar18 + 1),iEnd,pBVar13,iStart);
        uVar23 = sVar10 + 4;
        bVar7 = false;
      }
      else {
        uVar23 = 0;
      }
      uVar11 = uVar23;
      if (bVar7) {
        local_58 = 999999999;
        uVar11 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                           (local_40,(BYTE *)piVar16,iEnd,&local_58);
        sVar10 = local_58;
        piVar18 = piVar16;
        if (uVar11 <= uVar23) {
          uVar11 = uVar23;
          sVar10 = 0;
          piVar18 = piVar17;
        }
        piVar17 = piVar18;
        if (3 < uVar11) {
          if (sVar10 == 0) goto LAB_00144d4a;
          pBVar14 = (BYTE *)((long)piVar17 + (-(long)pBVar3 - sVar10) + -0xfffffffe);
          pBVar15 = pBVar3;
          pBVar13 = iStart;
          if ((uint)pBVar14 < uVar2) {
            pBVar15 = pBVar19;
            pBVar13 = local_48;
          }
          if ((src < piVar17) && (uVar23 = (ulong)pBVar14 & 0xffffffff, pBVar13 < pBVar15 + uVar23))
          {
            pBVar15 = pBVar15 + uVar23;
            do {
              piVar16 = (int *)((long)piVar17 + -1);
              pBVar15 = pBVar15 + -1;
              if ((*(BYTE *)piVar16 != *pBVar15) ||
                 (uVar11 = uVar11 + 1, piVar17 = piVar16, piVar16 <= src)) break;
            } while (pBVar13 < pBVar15);
          }
          UVar12 = (int)sVar10 + 1;
          UVar21 = (int)sVar10 - 2;
          UVar20 = UVar22;
          goto LAB_00144d79;
        }
        piVar16 = (int *)((long)piVar16 + ((long)piVar16 - (long)src >> 8) + 1);
      }
      else {
LAB_00144d4a:
        UVar12 = 1;
        UVar21 = UVar22;
LAB_00144d79:
        uVar23 = (long)piVar17 - (long)src;
        pBVar15 = seqStore->lit;
        pBVar13 = pBVar15 + uVar23;
        do {
          *(undefined8 *)pBVar15 = *src;
          pBVar15 = pBVar15 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar15 < pBVar13);
        seqStore->lit = seqStore->lit + uVar23;
        if (0xffff < uVar23) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar6 = seqStore->sequences;
        psVar6->litLength = (U16)uVar23;
        psVar6->offset = UVar12;
        if (0xffff < uVar11 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar6 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar6->matchLength = (U16)(uVar11 - 3);
        seqStore->sequences = psVar6 + 1;
        piVar16 = (int *)((long)piVar17 + uVar11);
        src = piVar16;
        do {
          UVar22 = UVar21;
          if (piVar1 < piVar16) break;
          uVar9 = ((int)piVar16 - (int)pBVar3) - UVar20;
          pBVar13 = pBVar3;
          if (uVar9 < uVar2) {
            pBVar13 = pBVar19;
          }
          if ((uVar9 - uVar2 < 0xfffffffd) && (*(int *)(pBVar13 + uVar9) == *piVar16)) {
            pBVar15 = iEnd;
            if (uVar9 < uVar2) {
              pBVar15 = pBVar5;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar16 + 1),(BYTE *)((long)(pBVar13 + uVar9) + 4),iEnd,
                                pBVar15,iStart);
            *(undefined8 *)seqStore->lit = *src;
            psVar6 = seqStore->sequences;
            psVar6->litLength = 0;
            psVar6->offset = 1;
            if (0xffff < sVar10 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar6 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar6->matchLength = (U16)(sVar10 + 1);
            seqStore->sequences = psVar6 + 1;
            piVar16 = (int *)((long)piVar16 + sVar10 + 4);
            bVar7 = true;
            src = piVar16;
            UVar21 = UVar20;
          }
          else {
            bVar7 = false;
            UVar22 = UVar20;
          }
          UVar20 = UVar22;
          UVar22 = UVar21;
        } while (bVar7);
      }
    } while (piVar16 < piVar1);
  }
  *local_50 = UVar22;
  local_50[1] = UVar20;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 0, ZSTD_dictMatchState);
}